

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_measures.cc
# Opt level: O2

S1Angle __thiscall S2::GetLength(S2 *this,S2PointSpan polyline)

{
  int i;
  pointer pVVar1;
  S1Angle SVar2;
  S1Angle local_28;
  
  SVar2.radians_ = 0.0;
  for (pVVar1 = (pointer)0x1; pVVar1 < polyline.ptr_; pVVar1 = (pointer)((long)pVVar1->c_ + 1)) {
    S1Angle::S1Angle(&local_28,(S2Point *)this,(S2Point *)(this + 0x18));
    SVar2.radians_ = SVar2.radians_ + local_28.radians_;
    this = this + 0x18;
  }
  return (S1Angle)SVar2.radians_;
}

Assistant:

S1Angle GetLength(S2PointSpan polyline) {
  S1Angle length;
  for (int i = 1; i < polyline.size(); ++i) {
    length += S1Angle(polyline[i - 1], polyline[i]);
  }
  return length;
}